

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::createInstance
          (GridRenderTestCase *this,Context *context)

{
  GridRenderTestInstance *this_00;
  Params local_20;
  Params params;
  Context *context_local;
  GridRenderTestCase *this_local;
  
  params = (Params)context;
  GridRenderTestInstance::Params::Params(&local_20);
  local_20.flags = this->m_flags;
  local_20.numLayers = this->m_numLayers;
  this_00 = (GridRenderTestInstance *)operator_new(0x18);
  GridRenderTestInstance::GridRenderTestInstance(this_00,(Context *)params,&local_20);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* GridRenderTestCase::createInstance (Context& context) const
{
	GridRenderTestInstance::Params params;

	params.flags	 = m_flags;
	params.numLayers = m_numLayers;

	return new GridRenderTestInstance(context, params);
}